

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.h
# Opt level: O3

int GetDigitalInputOntrak(ONTRAK *pOntrak,int channel,int *pValue)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  char *__s;
  char recvbuf [64];
  char sendbuf [64];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint8 local_78 [72];
  
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0x20] = '\0';
  local_78[0x21] = '\0';
  local_78[0x22] = '\0';
  local_78[0x23] = '\0';
  local_78[0x24] = '\0';
  local_78[0x25] = '\0';
  local_78[0x26] = '\0';
  local_78[0x27] = '\0';
  local_78[0x28] = '\0';
  local_78[0x29] = '\0';
  local_78[0x2a] = '\0';
  local_78[0x2b] = '\0';
  local_78[0x2c] = '\0';
  local_78[0x2d] = '\0';
  local_78[0x2e] = '\0';
  local_78[0x2f] = '\0';
  local_78[0x30] = '\0';
  local_78[0x31] = '\0';
  local_78[0x32] = '\0';
  local_78[0x33] = '\0';
  local_78[0x34] = '\0';
  local_78[0x35] = '\0';
  local_78[0x36] = '\0';
  local_78[0x37] = '\0';
  local_78[0x38] = '\0';
  local_78[0x39] = '\0';
  local_78[0x3a] = '\0';
  local_78[0x3b] = '\0';
  local_78[0x3c] = '\0';
  local_78[0x3d] = '\0';
  local_78[0x3e] = '\0';
  local_78[0x3f] = '\0';
  sprintf((char *)local_78,"1RPA%d\r",channel);
  sVar2 = strlen((char *)local_78);
  iVar1 = WriteDataOntrak(pOntrak,local_78,(int)sVar2,pOntrak->bytedelayus);
  iVar4 = 1;
  if (iVar1 == 0) {
    if ((pOntrak->bSaveRawData != 0) && ((FILE *)pOntrak->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_78,(long)(int)sVar2,1,(FILE *)pOntrak->pfSaveFile);
      fflush((FILE *)pOntrak->pfSaveFile);
    }
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    iVar1 = (pOntrak->RS232Port).DevType;
    __s = "Error reading data from a Ontrak. ";
    if (iVar1 - 1U < 4) {
      iVar1 = (pOntrak->RS232Port).s;
      uVar7 = 0;
      do {
        sVar3 = recv(iVar1,(void *)((long)&local_b8 + uVar7),(ulong)(2 - (int)uVar7),0);
        if ((int)sVar3 < 1) goto LAB_001b3ecb;
        uVar5 = (int)uVar7 + (int)sVar3;
        uVar7 = (ulong)uVar5;
      } while ((int)uVar5 < 2);
    }
    else {
      if (iVar1 != 0) goto LAB_001b3ecb;
      iVar1 = *(int *)&(pOntrak->RS232Port).hDev;
      lVar8 = 0;
      do {
        iVar6 = (int)lVar8;
        sVar3 = read(iVar1,(void *)((long)&local_b8 + lVar8),(ulong)(2 - iVar6));
        if ((int)sVar3 < 1) goto LAB_001b3ecb;
        lVar8 = 1;
      } while ((uint)(iVar6 + (int)sVar3) < 2);
    }
    if ((pOntrak->bSaveRawData != 0) && ((FILE *)pOntrak->pfSaveFile != (FILE *)0x0)) {
      fwrite(&local_b8,2,1,(FILE *)pOntrak->pfSaveFile);
      fflush((FILE *)pOntrak->pfSaveFile);
    }
    iVar1 = __isoc99_sscanf(&local_b8,"%d",pValue);
    if (iVar1 == 1) {
      return 0;
    }
    iVar4 = 4;
    __s = "Error reading data from a Ontrak : Invalid data. ";
  }
  else {
    __s = "Error writing data to a Ontrak. ";
  }
LAB_001b3ecb:
  puts(__s);
  return iVar4;
}

Assistant:

inline int GetDigitalInputOntrak(ONTRAK* pOntrak, int channel, int* pValue)
{
	char sendbuf[MAX_NB_BYTES_ONTRAK];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_ONTRAK];
	int recvbuflen = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "1RPA%d\r", channel);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataOntrak(pOntrak, (unsigned char*)sendbuf, sendbuflen, pOntrak->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a Ontrak. \n");
		return EXIT_FAILURE;
	}
	if ((pOntrak->bSaveRawData)&&(pOntrak->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pOntrak->pfSaveFile);
		fflush(pOntrak->pfSaveFile);
	}

	// Prepare the buffer that should receive data from the device.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 2; // The last character must be a 0 to be a valid string for sscanf.

	if (ReadAllRS232Port(&pOntrak->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		printf("Error reading data from a Ontrak. \n");
		return EXIT_FAILURE;
	}
	if ((pOntrak->bSaveRawData)&&(pOntrak->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pOntrak->pfSaveFile);
		fflush(pOntrak->pfSaveFile);
	}

	// Display and analyze received data.
	//printf("Received : \"%s\"\n", recvbuf);
	if (sscanf(recvbuf, "%d", pValue) != 1)
	{
		printf("Error reading data from a Ontrak : Invalid data. \n");
		return EXIT_INVALID_DATA;
	}

	return EXIT_SUCCESS;
}